

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

bool __thiscall GlobOpt::PrepareForIgnoringIntOverflow(GlobOpt *this,Instr *instr)

{
  Type *pppBVar1;
  code *pcVar2;
  byte bVar3;
  bool bVar4;
  bool bVar5;
  BOOLEAN BVar6;
  BOOLEAN BVar7;
  SymID id_00;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  undefined4 *puVar11;
  Instr *pIVar12;
  IntOverflowDoesNotMatterRange *pIVar13;
  BVSparse<Memory::JitArenaAllocator> *pBVar14;
  Sym *this_00;
  GlobOptBlockData *pGVar15;
  PropertySym *propertySym;
  ValueInfo *pVVar16;
  FloatConstantValueInfo *this_01;
  StackSym *pSVar17;
  BVSparse<Memory::JitArenaAllocator> *pBVar18;
  JITTimeFunctionBody *pJVar19;
  char16 *pcVar20;
  char16 *pcVar21;
  FloatConstType value_00;
  bool local_21a;
  Value *local_1f8;
  bool local_1b1;
  wchar local_1a8 [4];
  char16 debugStringBuffer_1 [42];
  BVSparse<Memory::JitArenaAllocator> *deadSymsRequiredToBeInt;
  BVSparse<Memory::JitArenaAllocator> *liveSyms;
  BVSparse<Memory::JitArenaAllocator> *lossySymsToExclude;
  BVSparse<Memory::JitArenaAllocator> *symsToExclude_1;
  wchar local_128 [4];
  char16 debugStringBuffer [42];
  bool needsToBeLossless;
  StackSym *copyPropSym;
  bool isInt32OrUInt32Float;
  Value *value;
  Sym *sym;
  SparseBVUnit _unit;
  BVIndex _startIndex;
  BVIndex _offset;
  BVSparseNode<Memory::JitArenaAllocator> *_curNode;
  BVIndex id;
  SymID couldNotConvertSymId;
  BVSparse<Memory::JitArenaAllocator> *symsToInclude;
  BVSparse<Memory::JitArenaAllocator> *symsToExclude;
  undefined1 local_68 [8];
  BVSparse<Memory::JitArenaAllocator> tempBv2;
  BVSparse<Memory::JitArenaAllocator> tempBv1;
  bool isBoundary;
  Instr *instr_local;
  GlobOpt *this_local;
  
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x36d7,"(instr)","instr");
    if (!bVar4) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 0;
  }
  bVar4 = instr->m_opcode == NoIntOverflowBoundary;
  if ((*(ushort *)&instr->field_0x36 >> 8 & 1) != 0) {
    local_1b1 = true;
    if ((*(uint *)&this->field_0xf4 >> 1 & 1) != 0) {
      local_1b1 = OpCodeAttr::IsInt32(instr->m_opcode);
    }
    *(ushort *)&instr->field_0x36 = *(ushort *)&instr->field_0x36 & 0xfeff | (ushort)local_1b1 << 8;
  }
  bVar3 = bVar4;
  if (this->intOverflowDoesNotMatterRange == (IntOverflowDoesNotMatterRange *)0x0) {
    if ((*(uint *)&this->field_0xf4 >> 1 & 1) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x36e4,"(intOverflowCurrentlyMattersInRange)",
                         "intOverflowCurrentlyMattersInRange");
      if (!bVar4) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 0;
    }
  }
  else {
    pIVar12 = IntOverflowDoesNotMatterRange::LastInstr(this->intOverflowDoesNotMatterRange);
    if (instr == pIVar12) {
      if (!bVar4) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar11 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x36ec,"(isBoundary)","isBoundary");
        if (!bVar4) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar11 = 0;
      }
      *(uint *)&this->field_0xf4 = *(uint *)&this->field_0xf4 & 0xfffffffd | 2;
      pIVar13 = IntOverflowDoesNotMatterRange::Next(this->intOverflowDoesNotMatterRange);
      this->intOverflowDoesNotMatterRange = pIVar13;
    }
    else if (((*(uint *)&this->field_0xf4 >> 1 & 1) != 0) &&
            (pIVar12 = IntOverflowDoesNotMatterRange::FirstInstr
                                 (this->intOverflowDoesNotMatterRange), instr == pIVar12)) {
      if (!bVar4) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar11 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x36ff,"(isBoundary)","isBoundary");
        if (!bVar5) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar11 = 0;
      }
      this->field_0xf4 = this->field_0xf4 & 0xfd;
      BVSparse<Memory::JitArenaAllocator>::BVSparse
                ((BVSparse<Memory::JitArenaAllocator> *)&tempBv2.lastUsedNodePrevNextField,
                 this->tempAlloc);
      BVSparse<Memory::JitArenaAllocator>::BVSparse
                ((BVSparse<Memory::JitArenaAllocator> *)local_68,this->tempAlloc);
      pppBVar1 = &tempBv2.lastUsedNodePrevNextField;
      _curNode._4_4_ = 0;
      pBVar14 = IntOverflowDoesNotMatterRange::SymsRequiredToBeInt
                          (this->intOverflowDoesNotMatterRange);
      __startIndex = pBVar14->head;
LAB_005846f4:
      if (__startIndex != (Type_conflict)0x0) {
        _unit.word._0_4_ = __startIndex->startIndex;
        sym = (Sym *)(__startIndex->data).word;
        _unit.word._4_4_ = BVUnitT<unsigned_long>::GetNextBit((BVUnitT<unsigned_long> *)&sym);
LAB_00584744:
        if (_unit.word._4_4_ == 0xffffffff) goto LAB_00584de6;
        id_00 = (Type)_unit.word + _unit.word._4_4_;
        BVUnitT<unsigned_long>::Clear((BVUnitT<unsigned_long> *)&sym,_unit.word._4_4_);
        this_00 = SymTable::Find(this->func->m_symTable,id_00);
        if (this_00 == (Sym *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar11 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                             ,0x3718,"(sym)","sym");
          if (!bVar5) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar11 = 0;
        }
        bVar5 = Sym::IsStackSym(this_00);
        if (bVar5) {
          pGVar15 = CurrentBlockData(this);
          local_1f8 = GlobOptBlockData::FindValue(pGVar15,this_00);
        }
        else {
          pGVar15 = CurrentBlockData(this);
          propertySym = Sym::AsPropertySym(this_00);
          local_1f8 = GlobOptBlockData::FindFuturePropertyValue(pGVar15,propertySym);
        }
        if (local_1f8 == (Value *)0x0) {
          *(uint *)&this->field_0xf4 = *(uint *)&this->field_0xf4 & 0xfffffffd | 2;
          __startIndex = (Type_conflict)0x0;
          _curNode._4_4_ = id_00;
          goto LAB_00584de6;
        }
        pVVar16 = ::Value::GetValueInfo(local_1f8);
        bVar5 = ValueInfo::IsFloatConstant(pVVar16);
        local_21a = false;
        if (bVar5) {
          pVVar16 = ::Value::GetValueInfo(local_1f8);
          this_01 = ValueInfo::AsFloatConstant(pVVar16);
          value_00 = FloatConstantValueInfo::FloatValue(this_01);
          local_21a = Js::JavascriptNumber::IsInt32OrUInt32(value_00);
        }
        pVVar16 = ::Value::GetValueInfo(local_1f8);
        bVar5 = ValueType::IsInt(&pVVar16->super_ValueType);
        if ((!bVar5) && (local_21a == false)) {
          bVar5 = DoAggressiveIntTypeSpec(this);
          if (bVar5) {
            pVVar16 = ::Value::GetValueInfo(local_1f8);
            bVar5 = ValueType::IsLikelyInt(&pVVar16->super_ValueType);
            if (bVar5) {
              bVar5 = IsLoopPrePass(this);
              if (!bVar5) {
                pGVar15 = CurrentBlockData(this);
                pSVar17 = GlobOptBlockData::GetCopyPropSym(pGVar15,this_00,local_1f8);
                if (pSVar17 != (StackSym *)0x0) {
                  BVSparse<Memory::JitArenaAllocator>::Set
                            ((BVSparse<Memory::JitArenaAllocator> *)pppBVar1,this_00->m_id);
                  BVar6 = BVSparse<Memory::JitArenaAllocator>::Test
                                    ((BVSparse<Memory::JitArenaAllocator> *)pppBVar1,
                                     (pSVar17->super_Sym).m_id);
                  if (BVar6 != '\0') {
                    AssertCount = AssertCount + 1;
                    Js::Throw::LogAssert();
                    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                    *puVar11 = 1;
                    bVar5 = Js::Throw::ReportAssert
                                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                                       ,0x3753,"(!symsToExclude.Test(copyPropSym->m_id))",
                                       "!symsToExclude.Test(copyPropSym->m_id)");
                    if (!bVar5) {
                      pcVar2 = (code *)invalidInstructionException();
                      (*pcVar2)();
                    }
                    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                    *puVar11 = 0;
                  }
                  pBVar14 = IntOverflowDoesNotMatterRange::SymsRequiredToBeLossyInt
                                      (this->intOverflowDoesNotMatterRange);
                  BVar6 = BVSparse<Memory::JitArenaAllocator>::Test(pBVar14,this_00->m_id);
                  pBVar14 = IntOverflowDoesNotMatterRange::SymsRequiredToBeInt
                                      (this->intOverflowDoesNotMatterRange);
                  BVar7 = BVSparse<Memory::JitArenaAllocator>::Test
                                    (pBVar14,(pSVar17->super_Sym).m_id);
                  if ((BVar7 == '\0') &&
                     (BVar7 = BVSparse<Memory::JitArenaAllocator>::TestAndSet
                                        ((BVSparse<Memory::JitArenaAllocator> *)local_68,
                                         (pSVar17->super_Sym).m_id), BVar7 == '\0')) {
                    if (BVar6 != '\0') {
                      pBVar14 = IntOverflowDoesNotMatterRange::SymsRequiredToBeLossyInt
                                          (this->intOverflowDoesNotMatterRange);
                      BVSparse<Memory::JitArenaAllocator>::Set(pBVar14,(pSVar17->super_Sym).m_id);
                    }
                  }
                  else if (BVar6 == '\0') {
                    pBVar14 = IntOverflowDoesNotMatterRange::SymsRequiredToBeLossyInt
                                        (this->intOverflowDoesNotMatterRange);
                    BVSparse<Memory::JitArenaAllocator>::Clear(pBVar14,(pSVar17->super_Sym).m_id);
                  }
                  goto LAB_00584dc1;
                }
                bVar5 = Sym::IsStackSym(this_00);
                if (!bVar5) {
                  *(uint *)&this->field_0xf4 = *(uint *)&this->field_0xf4 & 0xfffffffd | 2;
                  __startIndex = (Type_conflict)0x0;
                  _curNode._4_4_ = id_00;
                  goto LAB_00584de6;
                }
              }
              goto LAB_00584dc1;
            }
          }
          *(uint *)&this->field_0xf4 = *(uint *)&this->field_0xf4 & 0xfffffffd | 2;
          __startIndex = (Type_conflict)0x0;
          _curNode._4_4_ = id_00;
          goto LAB_00584de6;
        }
        bVar5 = IsLoopPrePass(this);
        if (!bVar5) {
          BVSparse<Memory::JitArenaAllocator>::Set
                    ((BVSparse<Memory::JitArenaAllocator> *)pppBVar1,this_00->m_id);
        }
LAB_00584dc1:
        _unit.word._4_4_ = BVUnitT<unsigned_long>::GetNextBit((BVUnitT<unsigned_long> *)&sym);
        goto LAB_00584744;
      }
LAB_00584e0a:
      if ((*(uint *)&this->field_0xf4 >> 1 & 1) == 0) {
        bVar5 = IsLoopPrePass(this);
        if (bVar5) {
          bVar5 = true;
          this_local._7_1_ = bVar4;
        }
        else {
          pBVar14 = IntOverflowDoesNotMatterRange::SymsRequiredToBeInt
                              (this->intOverflowDoesNotMatterRange);
          BVSparse<Memory::JitArenaAllocator>::Minus
                    (pBVar14,(BVSparse<Memory::JitArenaAllocator> *)pppBVar1);
          pBVar14 = IntOverflowDoesNotMatterRange::SymsRequiredToBeLossyInt
                              (this->intOverflowDoesNotMatterRange);
          BVSparse<Memory::JitArenaAllocator>::Minus
                    (pBVar14,(BVSparse<Memory::JitArenaAllocator> *)pppBVar1);
          pBVar14 = IntOverflowDoesNotMatterRange::SymsRequiredToBeInt
                              (this->intOverflowDoesNotMatterRange);
          BVSparse<Memory::JitArenaAllocator>::Or
                    (pBVar14,(BVSparse<Memory::JitArenaAllocator> *)local_68);
          pppBVar1 = &tempBv2.lastUsedNodePrevNextField;
          pGVar15 = CurrentBlockData(this);
          pBVar14 = pGVar15->liveInt32Syms;
          pGVar15 = CurrentBlockData(this);
          BVSparse<Memory::JitArenaAllocator>::Minus
                    ((BVSparse<Memory::JitArenaAllocator> *)pppBVar1,pBVar14,
                     pGVar15->liveLossyInt32Syms);
          pBVar14 = IntOverflowDoesNotMatterRange::SymsRequiredToBeLossyInt
                              (this->intOverflowDoesNotMatterRange);
          pGVar15 = CurrentBlockData(this);
          BVSparse<Memory::JitArenaAllocator>::And
                    ((BVSparse<Memory::JitArenaAllocator> *)local_68,pBVar14,
                     pGVar15->liveLossyInt32Syms);
          BVSparse<Memory::JitArenaAllocator>::Or
                    ((BVSparse<Memory::JitArenaAllocator> *)pppBVar1,
                     (BVSparse<Memory::JitArenaAllocator> *)local_68);
          pBVar14 = IntOverflowDoesNotMatterRange::SymsRequiredToBeInt
                              (this->intOverflowDoesNotMatterRange);
          BVSparse<Memory::JitArenaAllocator>::Minus
                    (pBVar14,(BVSparse<Memory::JitArenaAllocator> *)pppBVar1);
          pBVar14 = IntOverflowDoesNotMatterRange::SymsRequiredToBeLossyInt
                              (this->intOverflowDoesNotMatterRange);
          BVSparse<Memory::JitArenaAllocator>::Minus
                    (pBVar14,(BVSparse<Memory::JitArenaAllocator> *)pppBVar1);
          pppBVar1 = &tempBv2.lastUsedNodePrevNextField;
          unique0x00004780 = (BVSparse<Memory::JitArenaAllocator> *)local_68;
          pGVar15 = CurrentBlockData(this);
          pBVar14 = pGVar15->liveInt32Syms;
          pGVar15 = CurrentBlockData(this);
          BVSparse<Memory::JitArenaAllocator>::Or
                    ((BVSparse<Memory::JitArenaAllocator> *)pppBVar1,pBVar14,
                     pGVar15->liveFloat64Syms);
          pGVar15 = CurrentBlockData(this);
          BVSparse<Memory::JitArenaAllocator>::Or
                    ((BVSparse<Memory::JitArenaAllocator> *)pppBVar1,pGVar15->liveVarSyms);
          pBVar14 = stack0xfffffffffffffeb0;
          pBVar18 = IntOverflowDoesNotMatterRange::SymsRequiredToBeInt
                              (this->intOverflowDoesNotMatterRange);
          BVSparse<Memory::JitArenaAllocator>::Minus
                    (pBVar14,pBVar18,(BVSparse<Memory::JitArenaAllocator> *)pppBVar1);
          bVar5 = BVSparse<Memory::JitArenaAllocator>::IsEmpty(stack0xfffffffffffffeb0);
          if (!bVar5) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar11 = 1;
            bVar5 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                               ,0x37b1,"(deadSymsRequiredToBeInt.IsEmpty())",
                               "deadSymsRequiredToBeInt.IsEmpty()");
            if (!bVar5) {
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar11 = 0;
          }
          bVar5 = false;
        }
      }
      else {
        uVar8 = Func::GetSourceContextId(this->func);
        uVar9 = Func::GetLocalFunctionId(this->func);
        bVar5 = Js::Phases::IsEnabled
                          ((Phases *)&DAT_01ec1678,TrackCompoundedIntOverflowPhase,uVar8,uVar9);
        if ((bVar5) && (bVar5 = IsLoopPrePass(this), !bVar5)) {
          pJVar19 = Func::GetJITFunctionBody(this->func);
          pcVar20 = JITTimeFunctionBody::GetDisplayName(pJVar19);
          pcVar21 = Func::GetDebugNumberSet(this->func,(wchar (*) [42])local_128);
          uVar10 = BasicBlock::GetBlockNum(this->currentBlock);
          Output::Print(L"TrackCompoundedIntOverflow - Top function: %s (%s), Phase: %s, Block: %u, Disabled ignoring overflows\n"
                        ,pcVar20,pcVar21,0x176f8de,(ulong)uVar10);
          Output::Print(L"    Input sym could not be turned into an int:   %u\n",
                        (ulong)_curNode._4_4_);
          Output::Print(L"    First instr: ");
          IR::Instr::Dump(instr->m_next);
          Output::Flush();
        }
        pIVar13 = IntOverflowDoesNotMatterRange::Next(this->intOverflowDoesNotMatterRange);
        this->intOverflowDoesNotMatterRange = pIVar13;
        bVar5 = true;
        this_local._7_1_ = bVar4;
      }
      BVSparse<Memory::JitArenaAllocator>::~BVSparse
                ((BVSparse<Memory::JitArenaAllocator> *)local_68);
      BVSparse<Memory::JitArenaAllocator>::~BVSparse
                ((BVSparse<Memory::JitArenaAllocator> *)&tempBv2.lastUsedNodePrevNextField);
      bVar3 = this_local._7_1_;
      if (!bVar5) {
        pBVar14 = IntOverflowDoesNotMatterRange::SymsRequiredToBeInt
                            (this->intOverflowDoesNotMatterRange);
        pBVar18 = IntOverflowDoesNotMatterRange::SymsRequiredToBeLossyInt
                            (this->intOverflowDoesNotMatterRange);
        BVSparse<Memory::JitArenaAllocator>::Minus(pBVar14,pBVar18);
        uVar8 = Func::GetSourceContextId(this->func);
        uVar9 = Func::GetLocalFunctionId(this->func);
        bVar5 = Js::Phases::IsEnabled
                          ((Phases *)&DAT_01ec1678,TrackCompoundedIntOverflowPhase,uVar8,uVar9);
        if (bVar5) {
          pJVar19 = Func::GetJITFunctionBody(this->func);
          pcVar20 = JITTimeFunctionBody::GetDisplayName(pJVar19);
          pcVar21 = Func::GetDebugNumberSet(this->func,(wchar (*) [42])local_1a8);
          uVar10 = BasicBlock::GetBlockNum(this->currentBlock);
          Output::Print(L"TrackCompoundedIntOverflow - Top function: %s (%s), Phase: %s, Block: %u\n"
                        ,pcVar20,pcVar21,0x176f8de,(ulong)uVar10);
          Output::Print(L"    Input syms to be int-specialized (lossless): ");
          pBVar14 = IntOverflowDoesNotMatterRange::SymsRequiredToBeInt
                              (this->intOverflowDoesNotMatterRange);
          BVSparse<Memory::JitArenaAllocator>::Dump(pBVar14);
          Output::Print(L"    Input syms to be converted to int (lossy):   ");
          pBVar14 = IntOverflowDoesNotMatterRange::SymsRequiredToBeLossyInt
                              (this->intOverflowDoesNotMatterRange);
          BVSparse<Memory::JitArenaAllocator>::Dump(pBVar14);
          Output::Print(L"    First instr: ");
          IR::Instr::Dump(instr->m_next);
          Output::Flush();
        }
        pBVar14 = IntOverflowDoesNotMatterRange::SymsRequiredToBeInt
                            (this->intOverflowDoesNotMatterRange);
        ToInt32(this,pBVar14,this->currentBlock,false,instr);
        pBVar14 = IntOverflowDoesNotMatterRange::SymsRequiredToBeLossyInt
                            (this->intOverflowDoesNotMatterRange);
        ToInt32(this,pBVar14,this->currentBlock,true,instr);
        bVar3 = bVar4;
      }
    }
  }
  this_local._7_1_ = bVar3;
  return (bool)(this_local._7_1_ & 1);
LAB_00584de6:
  if (__startIndex == (Type_conflict)0x0) goto LAB_00584e0a;
  __startIndex = __startIndex->next;
  goto LAB_005846f4;
}

Assistant:

bool
GlobOpt::PrepareForIgnoringIntOverflow(IR::Instr *const instr)
{
    Assert(instr);

    const bool isBoundary = instr->m_opcode == Js::OpCode::NoIntOverflowBoundary;

    // Update the instruction's "int overflow matters" flag based on whether we are currently allowing ignoring int overflows.
    // Some operations convert their srcs to int32s, those can still ignore int overflow.
    if(instr->ignoreIntOverflowInRange)
    {
        instr->ignoreIntOverflowInRange = !intOverflowCurrentlyMattersInRange || OpCodeAttr::IsInt32(instr->m_opcode);
    }

    if(!intOverflowDoesNotMatterRange)
    {
        Assert(intOverflowCurrentlyMattersInRange);

        // There are no more ranges of instructions where int overflow does not matter, in this block.
        return isBoundary;
    }

    if(instr == intOverflowDoesNotMatterRange->LastInstr())
    {
        Assert(isBoundary);

        // Reached the last instruction in the range
        intOverflowCurrentlyMattersInRange = true;
        intOverflowDoesNotMatterRange = intOverflowDoesNotMatterRange->Next();
        return isBoundary;
    }

    if(!intOverflowCurrentlyMattersInRange)
    {
        return isBoundary;
    }

    if(instr != intOverflowDoesNotMatterRange->FirstInstr())
    {
        // Have not reached the next range
        return isBoundary;
    }

    Assert(isBoundary);

    // This is the first instruction in a range of instructions where int overflow does not matter. There can be many inputs to
    // instructions in the range, some of which are inputs to the range itself (that is, the values are not defined in the
    // range). Ignoring int overflow is only valid for int operations, so we need to ensure that all inputs to the range are
    // int (not "likely int") before ignoring any overflows in the range. Ensuring that a sym with a "likely int" value is an
    // int requires a bail-out. These bail-out check need to happen before any overflows are ignored, otherwise it's too late.
    // The backward pass tracked all inputs into the range. Iterate over them and verify the values, and insert lossless
    // conversions to int as necessary, before the first instruction in the range. If for any reason all values cannot be
    // guaranteed to be ints, the optimization will be disabled for this range.
    intOverflowCurrentlyMattersInRange = false;
    {
        BVSparse<JitArenaAllocator> tempBv1(tempAlloc);
        BVSparse<JitArenaAllocator> tempBv2(tempAlloc);

        {
            // Just renaming the temp BVs for this section to indicate how they're used so that it makes sense
            BVSparse<JitArenaAllocator> &symsToExclude = tempBv1;
            BVSparse<JitArenaAllocator> &symsToInclude = tempBv2;
#if DBG_DUMP
            SymID couldNotConvertSymId = 0;
#endif
            FOREACH_BITSET_IN_SPARSEBV(id, intOverflowDoesNotMatterRange->SymsRequiredToBeInt())
            {
                Sym *const sym = func->m_symTable->Find(id);
                Assert(sym);

                // Some instructions with property syms are also tracked by the backward pass, and may be included in the range
                // (LdSlot for instance). These property syms don't get their values until either copy-prop resolves a value for
                // them, or a new value is created once the use of the property sym is reached. In either case, we're not that
                // far yet, so we need to find the future value of the property sym by evaluating copy-prop in reverse.
                Value *const value = sym->IsStackSym() ? CurrentBlockData()->FindValue(sym) : CurrentBlockData()->FindFuturePropertyValue(sym->AsPropertySym());
                if(!value)
                {
#if DBG_DUMP
                    couldNotConvertSymId = id;
#endif
                    intOverflowCurrentlyMattersInRange = true;
                    BREAK_BITSET_IN_SPARSEBV;
                }

                const bool isInt32OrUInt32Float =
                    value->GetValueInfo()->IsFloatConstant() &&
                    Js::JavascriptNumber::IsInt32OrUInt32(value->GetValueInfo()->AsFloatConstant()->FloatValue());
                if(value->GetValueInfo()->IsInt() || isInt32OrUInt32Float)
                {
                    if(!IsLoopPrePass())
                    {
                        // Input values that are already int can be excluded from int-specialization. We can treat unsigned
                        // int32 values as int32 values (ignoring the overflow), since the values will only be used inside the
                        // range where overflow does not matter.
                        symsToExclude.Set(sym->m_id);
                    }
                    continue;
                }

                if(!DoAggressiveIntTypeSpec() || !value->GetValueInfo()->IsLikelyInt())
                {
                    // When aggressive int specialization is off, syms with "likely int" values cannot be forced to int since
                    // int bail-out checks are not allowed in that mode. Similarly, with aggressive int specialization on, it
                    // wouldn't make sense to force non-"likely int" values to int since it would almost guarantee a bail-out at
                    // runtime. In both cases, just disable ignoring overflow for this range.
#if DBG_DUMP
                    couldNotConvertSymId = id;
#endif
                    intOverflowCurrentlyMattersInRange = true;
                    BREAK_BITSET_IN_SPARSEBV;
                }

                if(IsLoopPrePass())
                {
                    // The loop prepass does not modify bit-vectors. Since it doesn't add bail-out checks, it also does not need
                    // to specialize anything up-front. It only needs to be consistent in how it determines whether to allow
                    // ignoring overflow for a range, based on the values of inputs into the range.
                    continue;
                }

                // Since input syms are tracked in the backward pass, where there is no value tracking, it will not be aware of
                // copy-prop. If a copy-prop sym is available, it will be used instead, so exclude the original sym and include
                // the copy-prop sym for specialization.
                StackSym *const copyPropSym = CurrentBlockData()->GetCopyPropSym(sym, value);
                if(copyPropSym)
                {
                    symsToExclude.Set(sym->m_id);
                    Assert(!symsToExclude.Test(copyPropSym->m_id));

                    const bool needsToBeLossless =
                        !intOverflowDoesNotMatterRange->SymsRequiredToBeLossyInt()->Test(sym->m_id);
                    if(intOverflowDoesNotMatterRange->SymsRequiredToBeInt()->Test(copyPropSym->m_id) ||
                        symsToInclude.TestAndSet(copyPropSym->m_id))
                    {
                        // The copy-prop sym is already included
                        if(needsToBeLossless)
                        {
                            // The original sym needs to be lossless, so make the copy-prop sym lossless as well.
                            intOverflowDoesNotMatterRange->SymsRequiredToBeLossyInt()->Clear(copyPropSym->m_id);
                        }
                    }
                    else if(!needsToBeLossless)
                    {
                        // The copy-prop sym was not included before, and the original sym can be lossy, so make it lossy.
                        intOverflowDoesNotMatterRange->SymsRequiredToBeLossyInt()->Set(copyPropSym->m_id);
                    }
                }
                else if(!sym->IsStackSym())
                {
                    // Only stack syms can be converted to int, and copy-prop syms are stack syms. If a copy-prop sym was not
                    // found for the property sym, we can't ignore overflows in this range.
#if DBG_DUMP
                    couldNotConvertSymId = id;
#endif
                    intOverflowCurrentlyMattersInRange = true;
                    BREAK_BITSET_IN_SPARSEBV;
                }
            } NEXT_BITSET_IN_SPARSEBV;

            if(intOverflowCurrentlyMattersInRange)
            {
#if DBG_DUMP
                if(PHASE_TRACE(Js::TrackCompoundedIntOverflowPhase, func) && !IsLoopPrePass())
                {
                    char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
                    Output::Print(
                        _u("TrackCompoundedIntOverflow - Top function: %s (%s), Phase: %s, Block: %u, Disabled ignoring overflows\n"),
                        func->GetJITFunctionBody()->GetDisplayName(),
                        func->GetDebugNumberSet(debugStringBuffer),
                        Js::PhaseNames[Js::ForwardPhase],
                        currentBlock->GetBlockNum());
                    Output::Print(_u("    Input sym could not be turned into an int:   %u\n"), couldNotConvertSymId);
                    Output::Print(_u("    First instr: "));
                    instr->m_next->Dump();
                    Output::Flush();
                }
#endif
                intOverflowDoesNotMatterRange = intOverflowDoesNotMatterRange->Next();
                return isBoundary;
            }

            if(IsLoopPrePass())
            {
                return isBoundary;
            }

            // Update the syms to specialize after enumeration
            intOverflowDoesNotMatterRange->SymsRequiredToBeInt()->Minus(&symsToExclude);
            intOverflowDoesNotMatterRange->SymsRequiredToBeLossyInt()->Minus(&symsToExclude);
            intOverflowDoesNotMatterRange->SymsRequiredToBeInt()->Or(&symsToInclude);
        }

        {
            // Exclude syms that are already live as lossless int32, and exclude lossy conversions of syms that are already live
            // as lossy int32.
            //     symsToExclude = liveInt32Syms - liveLossyInt32Syms                   // syms live as lossless int
            //     lossySymsToExclude = symsRequiredToBeLossyInt & liveLossyInt32Syms;  // syms we want as lossy int that are already live as lossy int
            //     symsToExclude |= lossySymsToExclude
            //     symsRequiredToBeInt -= symsToExclude
            //     symsRequiredToBeLossyInt -= symsToExclude
            BVSparse<JitArenaAllocator> &symsToExclude = tempBv1;
            BVSparse<JitArenaAllocator> &lossySymsToExclude = tempBv2;
            symsToExclude.Minus(CurrentBlockData()->liveInt32Syms, CurrentBlockData()->liveLossyInt32Syms);
            lossySymsToExclude.And(
                intOverflowDoesNotMatterRange->SymsRequiredToBeLossyInt(),
                CurrentBlockData()->liveLossyInt32Syms);
            symsToExclude.Or(&lossySymsToExclude);
            intOverflowDoesNotMatterRange->SymsRequiredToBeInt()->Minus(&symsToExclude);
            intOverflowDoesNotMatterRange->SymsRequiredToBeLossyInt()->Minus(&symsToExclude);
        }

#if DBG
        {
            // Verify that the syms to be converted are live
            //     liveSyms = liveInt32Syms | liveFloat64Syms | liveVarSyms
            //     deadSymsRequiredToBeInt = symsRequiredToBeInt - liveSyms
            BVSparse<JitArenaAllocator> &liveSyms = tempBv1;
            BVSparse<JitArenaAllocator> &deadSymsRequiredToBeInt = tempBv2;
            liveSyms.Or(CurrentBlockData()->liveInt32Syms, CurrentBlockData()->liveFloat64Syms);
            liveSyms.Or(CurrentBlockData()->liveVarSyms);
            deadSymsRequiredToBeInt.Minus(intOverflowDoesNotMatterRange->SymsRequiredToBeInt(), &liveSyms);
            Assert(deadSymsRequiredToBeInt.IsEmpty());
        }
#endif
    }

    // Int-specialize the syms before the first instruction of the range (the current instruction)
    intOverflowDoesNotMatterRange->SymsRequiredToBeInt()->Minus(intOverflowDoesNotMatterRange->SymsRequiredToBeLossyInt());

#if DBG_DUMP
    if(PHASE_TRACE(Js::TrackCompoundedIntOverflowPhase, func))
    {
        char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
        Output::Print(
            _u("TrackCompoundedIntOverflow - Top function: %s (%s), Phase: %s, Block: %u\n"),
            func->GetJITFunctionBody()->GetDisplayName(),
            func->GetDebugNumberSet(debugStringBuffer),
            Js::PhaseNames[Js::ForwardPhase],
            currentBlock->GetBlockNum());
        Output::Print(_u("    Input syms to be int-specialized (lossless): "));
        intOverflowDoesNotMatterRange->SymsRequiredToBeInt()->Dump();
        Output::Print(_u("    Input syms to be converted to int (lossy):   "));
        intOverflowDoesNotMatterRange->SymsRequiredToBeLossyInt()->Dump();
        Output::Print(_u("    First instr: "));
        instr->m_next->Dump();
        Output::Flush();
    }
#endif

    ToInt32(intOverflowDoesNotMatterRange->SymsRequiredToBeInt(), currentBlock, false /* lossy */, instr);
    ToInt32(intOverflowDoesNotMatterRange->SymsRequiredToBeLossyInt(), currentBlock, true /* lossy */, instr);
    return isBoundary;
}